

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::DefaultsTest::testBuffersBindingPoints
          (DefaultsTest *this)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  bool bVar2;
  GLuint GVar3;
  GLint buffer_binding;
  GLint local_1b4;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  bVar2 = this->m_xfb_indexed_binding_points_count < 1;
  if (0 < this->m_xfb_indexed_binding_points_count) {
    GVar3 = 0;
    do {
      local_1b4 = -1;
      (*this->m_gl_getTransformFeedbacki_v)(this->m_xfb_dsa,0x8c8f,GVar3,&local_1b4);
      err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
      glu::checkError(err,"glGetTransformFeedbacki_v have failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                      ,0x151);
      if (local_1b4 != 0) {
        if (local_1b4 == -1) {
          local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b0 + 8),
                     "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_BINDING has not returned anything and error has not been generated."
                     ,0x89);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          this_00 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,
                     "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_BINDING has returned "
                     ,0x5b);
          std::ostream::operator<<(this_00,local_1b4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,", however 0 is expected.",0x18);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        return bVar2;
      }
      GVar3 = GVar3 + 1;
      bVar2 = this->m_xfb_indexed_binding_points_count <= (int)GVar3;
    } while ((int)GVar3 < this->m_xfb_indexed_binding_points_count);
  }
  return bVar2;
}

Assistant:

bool DefaultsTest::testBuffersBindingPoints()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check default binding points value. */
	for (glw::GLint i = 0; i < m_xfb_indexed_binding_points_count; ++i)
	{
		glw::GLint buffer_binding = -1;

		m_gl_getTransformFeedbacki_v(m_xfb_dsa, GL_TRANSFORM_FEEDBACK_BUFFER_BINDING, i, &buffer_binding);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTransformFeedbacki_v have failed");

		if (-1 == buffer_binding)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_BINDING has not returned "
				   "anything and error has not been generated."
				<< tcu::TestLog::EndMessage;

			return false;
		}
		else
		{
			if (0 != buffer_binding)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_BINDING has returned "
					<< buffer_binding << ", however 0 is expected." << tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	return true;
}